

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O2

void __thiscall Trie::Trie(Trie *this)

{
  _Rb_tree_header *p_Var1;
  Node root;
  value_type local_28;
  
  (this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).super__Vector_base<Trie::Node,_std::allocator<Trie::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->lookup)._M_t._M_impl.super__Rb_tree_header;
  (this->lookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lookup)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_28.index = 0;
  local_28.hasValue = false;
  local_28._9_7_ = 0;
  local_28.value = 0;
  std::vector<Trie::Node,_std::allocator<Trie::Node>_>::push_back(&this->nodes,&local_28);
  return;
}

Assistant:

Trie::Trie()
{
	Node root { 0, false, 0 };
	nodes.push_back(root);
}